

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadstorage.cpp
# Opt level: O2

void ** __thiscall QThreadStorageData::set(QThreadStorageData *this,void *p)

{
  void *pvVar1;
  QThreadData *pQVar2;
  pointer ppvVar3;
  Type *pTVar4;
  QBasicMutex *this_00;
  long lVar5;
  _func_void_void_ptr *p_Var6;
  long in_FS_OFFSET;
  QMessageLogger local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QThreadData::current();
  if (pQVar2 == (QThreadData *)0x0) {
    local_48.context.version = 2;
    local_48.context.function._4_4_ = 0;
    local_48.context.line = 0;
    local_48.context.file._0_4_ = 0;
    local_48.context.file._4_4_ = 0;
    local_48.context.function._0_4_ = 0;
    local_48.context.category = "default";
    ppvVar3 = (pointer)0x0;
    QMessageLogger::warning
              (&local_48,
               "QThreadStorage::set: QThreadStorage can only be used with threads started with QThread"
              );
  }
  else {
    lVar5 = (long)this->id;
    if ((pQVar2->tls).d.size <= lVar5) {
      QList<void_*>::resize(&pQVar2->tls,(long)(this->id + 1));
      lVar5 = (long)this->id;
    }
    ppvVar3 = QList<void_*>::data(&pQVar2->tls);
    ppvVar3 = ppvVar3 + lVar5;
    if (*ppvVar3 != (void *)0x0) {
      local_48.context.file._0_4_ = 0xaaaaaaaa;
      local_48.context.file._4_4_ = 0xaaaaaaaa;
      this_00 = &destructorsMutex;
      local_48.context.version = 0x67fb38;
      local_48.context.line = 0;
      QBasicMutex::lock(&destructorsMutex);
      pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_destructors>_>::
               operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_destructors>_>
                           *)this_00);
      if ((pTVar4 == (Type *)0x0) || ((ulong)(pTVar4->d).size <= (ulong)(long)this->id)) {
        p_Var6 = (_func_void_void_ptr *)0x0;
      }
      else {
        p_Var6 = (pTVar4->d).ptr[this->id];
      }
      QBasicMutex::unlock(&destructorsMutex);
      local_48.context.file._0_4_ = (uint)local_48.context.file & 0xffffff00;
      pvVar1 = *ppvVar3;
      *ppvVar3 = (void *)0x0;
      if (p_Var6 != (_func_void_void_ptr *)0x0) {
        (*p_Var6)(pvVar1);
      }
      QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)&local_48);
    }
    *ppvVar3 = p;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return ppvVar3;
  }
  __stack_chk_fail();
}

Assistant:

void **QThreadStorageData::set(void *p)
{
    QThreadData *data = QThreadData::current();
    if (!data) {
        qWarning("QThreadStorage::set: QThreadStorage can only be used with threads started with QThread");
        return nullptr;
    }
    QList<void *> &tls = data->tls;
    if (tls.size() <= id)
        tls.resize(id + 1);

    void *&value = tls[id];
    // delete any previous data
    if (value != nullptr) {
        DEBUG_MSG("QThreadStorageData: Deleting previous storage %d, data %p, for thread %p",
                id,
                value,
                data->thread.loadRelaxed());

        QMutexLocker locker(&destructorsMutex);
        DestructorMap *destr = destructors();
        void (*destructor)(void *) = destr ? destr->value(id) : nullptr;
        locker.unlock();

        void *q = value;
        value = nullptr;

        if (destructor)
            destructor(q);
    }

    // store new data
    value = p;
    DEBUG_MSG("QThreadStorageData: Set storage %d for thread %p to %p", id, data->thread.loadRelaxed(), p);
    return &value;
}